

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionType.cpp
# Opt level: O0

void __thiscall hdc::FunctionType::FunctionType(FunctionType *this)

{
  FunctionType *this_local;
  
  Type::Type(&this->super_Type);
  (this->super_Type).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_002207d8;
  std::vector<hdc::Type_*,_std::allocator<hdc::Type_*>_>::vector(&this->subtypes);
  ASTNode::setKind((ASTNode *)this,AST_FUNCTION_TYPE);
  return;
}

Assistant:

FunctionType::FunctionType() {
    setKind(AST_FUNCTION_TYPE);
}